

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t shift_bitmap(_Bool shift,_Bool ctrl,_Bool alt,_Bool *consumed_alt)

{
  int iVar1;
  int iVar2;
  wchar_t local_1c;
  wchar_t bitmap;
  _Bool *consumed_alt_local;
  _Bool alt_local;
  _Bool ctrl_local;
  _Bool shift_local;
  
  iVar1 = 0;
  if (alt) {
    iVar1 = 2;
  }
  iVar2 = 0;
  if (ctrl) {
    iVar2 = 4;
  }
  local_1c = (uint)shift + iVar1 + iVar2;
  if (local_1c != L'\0') {
    local_1c = local_1c + L'\x01';
  }
  if ((alt) && (consumed_alt != (_Bool *)0x0)) {
    *consumed_alt = true;
  }
  return local_1c;
}

Assistant:

static int shift_bitmap(bool shift, bool ctrl, bool alt, bool *consumed_alt)
{
    int bitmap = (shift ? 1 : 0) + (alt ? 2 : 0) + (ctrl ? 4 : 0);
    if (bitmap)
        bitmap++;
    if (alt && consumed_alt)
        *consumed_alt = true;
    return bitmap;
}